

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O0

void map_suite::test_nonobject_bool_two(void)

{
  mapped_type *pmVar1;
  string local_258 [40];
  key_type local_230 [2];
  undefined1 local_228 [8];
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> value;
  undefined1 local_1e8 [8];
  oarchive ar;
  ostringstream local_180 [8];
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            ((basic_oarchive<char> *)local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::map
            ((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *)
             local_228);
  local_230[1] = 2;
  pmVar1 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                       *)local_228,local_230 + 1);
  *pmVar1 = true;
  local_230[0] = 4;
  pmVar1 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                       *)local_228,local_230);
  *pmVar1 = false;
  boost::archive::detail::interface_oarchive<trial::protocol::json::basic_oarchive<char>>::
  operator<<((interface_oarchive<trial::protocol::json::basic_oarchive<char>> *)local_1e8,
             (map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *)
             local_228);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[21]>
            ("result.str()","\"[[2,true],[4,false]]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x21d,"void map_suite::test_nonobject_bool_two()",local_258,"[[2,true],[4,false]]");
  std::__cxx11::string::~string(local_258);
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::~map
            ((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *)
             local_228);
  trial::protocol::json::basic_oarchive<char>::~basic_oarchive((basic_oarchive<char> *)local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_nonobject_bool_two()
{
    std::ostringstream result;
    json::oarchive ar(result);
    std::map<int, bool> value;
    value[2] = true;
    value[4] = false;
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[[2,true],[4,false]]");
}